

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f * operator*(Matrix4f *__return_storage_ptr__,Matrix4f *m,float f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Matrix4f *pMVar8;
  int i;
  long lVar9;
  long lVar10;
  Matrix4f *product;
  
  pMVar8 = __return_storage_ptr__;
  uVar1 = *(undefined8 *)m->m_elements;
  uVar2 = *(undefined8 *)(m->m_elements + 2);
  uVar3 = *(undefined8 *)(m->m_elements + 4);
  uVar4 = *(undefined8 *)(m->m_elements + 6);
  uVar5 = *(undefined8 *)(m->m_elements + 8);
  uVar6 = *(undefined8 *)(m->m_elements + 10);
  uVar7 = *(undefined8 *)(m->m_elements + 0xe);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 0xc) = *(undefined8 *)(m->m_elements + 0xc);
  *(undefined8 *)(__return_storage_ptr__->m_elements + 0xe) = uVar7;
  *(undefined8 *)(__return_storage_ptr__->m_elements + 8) = uVar5;
  *(undefined8 *)(__return_storage_ptr__->m_elements + 10) = uVar6;
  *(undefined8 *)(__return_storage_ptr__->m_elements + 4) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->m_elements + 6) = uVar4;
  *(undefined8 *)__return_storage_ptr__->m_elements = uVar1;
  *(undefined8 *)(__return_storage_ptr__->m_elements + 2) = uVar2;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 0x10) {
      *(float *)((long)__return_storage_ptr__ + lVar10) =
           *(float *)((long)__return_storage_ptr__ + lVar10) * f;
    }
    __return_storage_ptr__ = (Matrix4f *)((long)__return_storage_ptr__ + 4);
  }
  return pMVar8;
}

Assistant:

Matrix4f operator * (const Matrix4f& m, float f) {
	Matrix4f product(m); // zeroes

	for( int i = 0; i < 4; ++i )
	{
		for( int j = 0; j < 4; ++j )
		{
            product(i, j) *= f;
		}
	}
	return product;
}